

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_control_impl.cc
# Opt level: O1

int16_t webrtc::anon_unknown_0::MapSetting(Mode mode)

{
  ostream *poVar1;
  FatalMessage local_180;
  
  if (mode < (kFixedDigital|kAdaptiveDigital)) {
    return (short)mode + 1;
  }
  rtc::FatalMessage::FatalMessage
            (&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/gain_control_impl.cc"
             ,0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_180,"Check failed: false",0x13);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&local_180);
  std::operator<<(poVar1,"# ");
  rtc::FatalMessage::~FatalMessage(&local_180);
}

Assistant:

int16_t MapSetting(GainControl::Mode mode) {
  switch (mode) {
    case GainControl::kAdaptiveAnalog:
      return kAgcModeAdaptiveAnalog;
    case GainControl::kAdaptiveDigital:
      return kAgcModeAdaptiveDigital;
    case GainControl::kFixedDigital:
      return kAgcModeFixedDigital;
  }
  RTC_DCHECK(false);
  return -1;
}